

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGhsMultiGenerator::Generate(cmLocalGhsMultiGenerator *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  reference ppcVar2;
  undefined1 local_140 [8];
  cmGhsMultiTargetGenerator tg;
  cmGeneratorTarget *gt;
  iterator __end1;
  iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  cmLocalGhsMultiGenerator *this_local;
  
  cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1,
             (this->super_cmLocalGenerator).GlobalGenerator,&this->super_cmLocalGenerator);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1
                     );
  gt = (cmGeneratorTarget *)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                     *)&gt), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar2;
    bVar1 = cmGeneratorTarget::IsInBuildSystem(this_00);
    if (bVar1) {
      cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator
                ((cmGhsMultiTargetGenerator *)local_140,this_00);
      cmGhsMultiTargetGenerator::Generate((cmGhsMultiTargetGenerator *)local_140);
      cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator((cmGhsMultiTargetGenerator *)local_140);
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__begin1);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::Generate()
{
  for (cmGeneratorTarget* gt :
       this->GlobalGenerator->GetLocalGeneratorTargetsInOrder(this)) {
    if (!gt->IsInBuildSystem()) {
      continue;
    }

    cmGhsMultiTargetGenerator tg(gt);
    tg.Generate();
  }
}